

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ossadmin_test.cc
# Opt level: O0

int test_get_bucket_policy(void)

{
  code *pcVar1;
  char *__s;
  OssAdminGetBucketPolicyRequestType *pOVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_249;
  int ret;
  HttpTestListener *local_228;
  HttpTestListener *listener;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0 [39];
  allocator<char> local_1c9;
  string local_1c8 [55];
  allocator<char> local_191;
  string local_190 [32];
  OssAdminGetBucketPolicyRequestType *local_170;
  OssAdmin *ossadmin;
  OssAdminGetBucketPolicyResponseType resp;
  OssAdminGetBucketPolicyRequestType req;
  
  aliyun::OssAdminGetBucketPolicyRequestType::OssAdminGetBucketPolicyRequestType
            ((OssAdminGetBucketPolicyRequestType *)((long)&resp.iam_policy.field_2 + 8));
  aliyun::OssAdminGetBucketPolicyResponseType::OssAdminGetBucketPolicyResponseType
            ((OssAdminGetBucketPolicyResponseType *)&ossadmin);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"cn-hangzhou",&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c8,"my_appid",&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"my_secret",&local_1f1);
  pOVar2 = (OssAdminGetBucketPolicyRequestType *)
           aliyun::OssAdmin::CreateOssAdminClient(local_190,local_1c8,local_1f0);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  local_170 = pOVar2;
  if (pOVar2 == (OssAdminGetBucketPolicyRequestType *)0x0) {
    aliyun::OssAdminGetBucketPolicyResponseType::~OssAdminGetBucketPolicyResponseType
              ((OssAdminGetBucketPolicyResponseType *)&ossadmin);
    aliyun::OssAdminGetBucketPolicyRequestType::~OssAdminGetBucketPolicyRequestType
              ((OssAdminGetBucketPolicyRequestType *)((long)&resp.iam_policy.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::OssAdmin::SetProxyHost((OssAdmin *)pOVar2,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::OssAdmin::SetUseTls((OssAdmin *)local_170,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_get_bucket_policy_response;
  local_228 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_249);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_249);
  HttpTestListener::Start(local_228);
  std::__cxx11::string::operator=((string *)(resp.iam_policy.field_2._M_local_buf + 8),"uid");
  std::__cxx11::string::operator=((string *)(req.uid.field_2._M_local_buf + 8),"bid");
  std::__cxx11::string::operator=((string *)(req.bid.field_2._M_local_buf + 8),"BucketName");
  std::__cxx11::string::operator=
            ((string *)(req.bucket_name.field_2._M_local_buf + 8),"OwnerAccount");
  aliyun::OssAdmin::GetBucketPolicy
            (local_170,(OssAdminGetBucketPolicyResponseType *)((long)&resp.iam_policy.field_2 + 8),
             (OssAdminErrorInfo *)&ossadmin);
  HttpTestListener::WaitComplete(local_228);
  pHVar3 = local_228;
  if (local_228 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_228);
    operator_delete(pHVar3,0x180);
  }
  pOVar2 = local_170;
  if (local_170 != (OssAdminGetBucketPolicyRequestType *)0x0) {
    aliyun::OssAdmin::~OssAdmin((OssAdmin *)local_170);
    operator_delete(pOVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_get_bucket_policy() {
  OssAdminGetBucketPolicyRequestType req;
  OssAdminGetBucketPolicyResponseType resp;
  OssAdmin* ossadmin = OssAdmin::CreateOssAdminClient("cn-hangzhou", "my_appid", "my_secret");
  if(!ossadmin) return 0;
  ossadmin->SetProxyHost("127.0.0.1:12234");
  ossadmin->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_get_bucket_policy_response);
  listener->Start();
  req.uid = "uid";
  req.bid = "bid";
  req.bucket_name = "BucketName";
  req.owner_account = "OwnerAccount";
  int ret = ossadmin->GetBucketPolicy(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete ossadmin;
}